

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCheckFacet(xmlSchemaFacetPtr facet,xmlSchemaTypePtr typeDecl,
                       xmlSchemaParserCtxtPtr pctxt,xmlChar *name)

{
  xmlSchemaTypeType type;
  xmlGenericErrorFunc p_Var1;
  xmlSchemaValType type_00;
  int iVar2;
  int iVar3;
  xmlSchemaParserCtxtPtr ctxt;
  xmlSchemaTypePtr type_01;
  xmlChar *pxVar4;
  xmlRegexpPtr pxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  char *pcVar8;
  xmlNodePtr pxVar9;
  xmlParserErrors error;
  xmlChar *pxVar10;
  xmlChar *local_38;
  
  iVar3 = -1;
  if (typeDecl == (xmlSchemaTypePtr)0x0 || facet == (xmlSchemaFacetPtr)0x0) {
    return -1;
  }
  iVar2 = 0;
  ctxt = pctxt;
  switch(facet->type) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
  case XML_SCHEMA_FACET_ENUMERATION:
    if ((typeDecl->type == XML_SCHEMA_TYPE_BASIC) ||
       (typeDecl = typeDecl->baseType, typeDecl != (xmlSchemaTypePtr)0x0)) {
      if ((pctxt == (xmlSchemaParserCtxtPtr)0x0) &&
         (ctxt = xmlSchemaNewParserCtxt("*"), ctxt == (xmlSchemaParserCtxtPtr)0x0)) {
        return -1;
      }
      iVar2 = xmlSchemaVCheckCVCSimpleType
                        ((xmlSchemaAbstractCtxtPtr)ctxt,facet->node,typeDecl,facet->value,
                         &facet->val,1,1,0);
      if (iVar2 == 0) {
        if (facet->val == (xmlSchemaValPtr)0x0) {
          if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaCheckFacet","value was not computed"
                      );
          }
          pp_Var6 = __xmlGenericError();
          p_Var1 = *pp_Var6;
          ppvVar7 = __xmlGenericErrorContext();
          iVar2 = 0;
          (*p_Var1)(*ppvVar7,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
                    ,0x49c3);
        }
        else {
          iVar2 = 0;
        }
        goto switchD_001a44ce_default;
      }
      if (-1 < iVar2) {
        if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
          local_38 = (xmlChar *)0x0;
          pxVar10 = facet->value;
          pxVar9 = facet->node;
          pxVar4 = xmlSchemaFormatQName(&local_38,typeDecl->targetNamespace,typeDecl->name);
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_INVALID_FACET_VALUE,pxVar9,
                             (xmlSchemaBasicItemPtr)facet,
                             "The value \'%s\' of the facet does not validate against the base type \'%s\'"
                             ,pxVar10,pxVar4);
          if (local_38 != (xmlChar *)0x0) {
            (*xmlFree)(local_38);
            return 0x6b5;
          }
          return 0x6b5;
        }
        iVar2 = 0x6b5;
        goto switchD_001a44ce_default;
      }
      if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
        xmlSchemaFreeParserCtxt(ctxt);
        return -1;
      }
      pxVar9 = facet->node;
      pxVar10 = facet->value;
      pxVar4 = xmlSchemaFacetTypeToString(facet->type);
      pcVar8 = 
      "Internal error: xmlSchemaCheckFacet, failed to validate the value \'%s\' of the facet \'%s\' against the base type"
      ;
      error = XML_SCHEMAP_INTERNAL;
      typeDecl = (xmlSchemaTypePtr)0x0;
      goto LAB_001a472c;
    }
    pcVar8 = "a type user derived type has no base type";
    goto LAB_001a46eb;
  case XML_SCHEMA_FACET_TOTALDIGITS:
    type_00 = XML_SCHEMAS_PINTEGER;
    break;
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
  case XML_SCHEMA_FACET_LENGTH:
  case XML_SCHEMA_FACET_MAXLENGTH:
  case XML_SCHEMA_FACET_MINLENGTH:
    type_00 = XML_SCHEMAS_NNINTEGER;
    break;
  case XML_SCHEMA_FACET_PATTERN:
    pxVar5 = xmlRegexpCompile(facet->value);
    facet->regexp = pxVar5;
    iVar3 = 0x6dc;
    iVar2 = 0;
    if (pxVar5 == (xmlRegexpPtr)0x0) {
      iVar2 = 0x6dc;
    }
    if (pxVar5 != (xmlRegexpPtr)0x0 || pctxt == (xmlSchemaParserCtxtPtr)0x0)
    goto switchD_001a44ce_default;
    pxVar10 = facet->value;
    pxVar9 = facet->node;
    pcVar8 = "The value \'%s\' of the facet \'pattern\' is not a valid regular expression";
    error = XML_SCHEMAP_REGEXP_INVALID;
    goto LAB_001a46d8;
  case XML_SCHEMA_FACET_WHITESPACE:
    iVar3 = xmlStrEqual(facet->value,(xmlChar *)"preserve");
    if (iVar3 != 0) {
      facet->whitespace = 1;
      goto switchD_001a44ce_default;
    }
    iVar3 = xmlStrEqual(facet->value,(xmlChar *)"replace");
    if (iVar3 != 0) {
      facet->whitespace = 2;
      goto switchD_001a44ce_default;
    }
    iVar3 = xmlStrEqual(facet->value,(xmlChar *)"collapse");
    if (iVar3 != 0) {
      facet->whitespace = 3;
      goto switchD_001a44ce_default;
    }
    if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return 0x6b5;
    }
    pxVar10 = facet->value;
    pxVar9 = facet->node;
    pcVar8 = "The value \'%s\' of the facet \'whitespace\' is not valid";
    iVar3 = 0x6b5;
    error = XML_SCHEMAP_INVALID_FACET_VALUE;
LAB_001a46d8:
    pxVar4 = (xmlChar *)0x0;
LAB_001a472c:
    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,error,pxVar9,(xmlSchemaBasicItemPtr)typeDecl,
                       pcVar8,pxVar10,pxVar4);
    return iVar3;
  default:
    goto switchD_001a44ce_default;
  }
  type_01 = xmlSchemaGetBuiltInType(type_00);
  iVar3 = xmlSchemaValidatePredefinedType(type_01,facet->value,&facet->val);
  iVar2 = 0;
  if (iVar3 == 0) {
switchD_001a44ce_default:
    if (ctxt != (xmlSchemaParserCtxtPtr)0x0 && pctxt == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaFreeParserCtxt(ctxt);
    }
    return iVar2;
  }
  if (-1 < iVar3) {
    if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return 0x6b5;
    }
    pxVar9 = facet->node;
    pxVar10 = facet->value;
    type = facet->type;
    pxVar4 = xmlSchemaFacetTypeToString(type);
    pcVar8 = "nonNegativeInteger";
    if (type == XML_SCHEMA_FACET_TOTALDIGITS) {
      pcVar8 = "positiveInteger";
    }
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,pxVar9,
                        (xmlSchemaBasicItemPtr)typeDecl,
                        "The value \'%s\' of the facet \'%s\' is not a valid \'%s\'",pxVar10,pxVar4,
                        (xmlChar *)pcVar8,(xmlChar *)0x0);
    return 0x6b5;
  }
  if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
    return -1;
  }
  pcVar8 = "validating facet value";
LAB_001a46eb:
  xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaCheckFacet",pcVar8);
  return -1;
}

Assistant:

int
xmlSchemaCheckFacet(xmlSchemaFacetPtr facet,
                    xmlSchemaTypePtr typeDecl,
                    xmlSchemaParserCtxtPtr pctxt,
		    const xmlChar * name ATTRIBUTE_UNUSED)
{
    int ret = 0, ctxtGiven;

    if ((facet == NULL) || (typeDecl == NULL))
        return(-1);
    /*
    * TODO: will the parser context be given if used from
    * the relaxNG module?
    */
    if (pctxt == NULL)
	ctxtGiven = 0;
    else
	ctxtGiven = 1;

    switch (facet->type) {
        case XML_SCHEMA_FACET_MININCLUSIVE:
        case XML_SCHEMA_FACET_MINEXCLUSIVE:
        case XML_SCHEMA_FACET_MAXINCLUSIVE:
        case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	case XML_SCHEMA_FACET_ENUMERATION: {
                /*
                 * Okay we need to validate the value
                 * at that point.
                 */
		xmlSchemaTypePtr base;

		/* 4.3.5.5 Constraints on enumeration Schema Components
		* Schema Component Constraint: enumeration valid restriction
		* It is an `error` if any member of {value} is not in the
		* `value space` of {base type definition}.
		*
		* minInclusive, maxInclusive, minExclusive, maxExclusive:
		* The value `must` be in the
		* `value space` of the `base type`.
		*/
		/*
		* This function is intended to deliver a compiled value
		* on the facet. In this implementation of XML Schemata the
		* type holding a facet, won't be a built-in type.
		* Thus to ensure that other API
		* calls (relaxng) do work, if the given type is a built-in
		* type, we will assume that the given built-in type *is
		* already* the base type.
		*/
		if (typeDecl->type != XML_SCHEMA_TYPE_BASIC) {
		    base = typeDecl->baseType;
		    if (base == NULL) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "a type user derived type has no base type");
			return (-1);
		    }
		} else
		    base = typeDecl;

		if (! ctxtGiven) {
		    /*
		    * A context is needed if called from RelaxNG.
		    */
		    pctxt = xmlSchemaNewParserCtxt("*");
		    if (pctxt == NULL)
			return (-1);
		}
		/*
		* NOTE: This call does not check the content nodes,
		* since they are not available:
		* facet->node is just the node holding the facet
		* definition, *not* the attribute holding the *value*
		* of the facet.
		*/
		ret = xmlSchemaVCheckCVCSimpleType(
		    ACTXT_CAST pctxt, facet->node, base,
		    facet->value, &(facet->val), 1, 1, 0);
                if (ret != 0) {
		    if (ret < 0) {
			/* No error message for RelaxNG. */
			if (ctxtGiven) {
			    xmlSchemaCustomErr(ACTXT_CAST pctxt,
				XML_SCHEMAP_INTERNAL, facet->node, NULL,
				"Internal error: xmlSchemaCheckFacet, "
				"failed to validate the value '%s' of the "
				"facet '%s' against the base type",
				facet->value, xmlSchemaFacetTypeToString(facet->type));
			}
			goto internal_error;
		    }
		    ret = XML_SCHEMAP_INVALID_FACET_VALUE;
		    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			xmlChar *str = NULL;

			xmlSchemaCustomErr(ACTXT_CAST pctxt,
			    ret, facet->node, WXS_BASIC_CAST facet,
			    "The value '%s' of the facet does not validate "
			    "against the base type '%s'",
			    facet->value,
			    xmlSchemaFormatQName(&str,
				base->targetNamespace, base->name));
			FREE_AND_NULL(str);
		    }
		    goto exit;
                } else if (facet->val == NULL) {
		    if (ctxtGiven) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "value was not computed");
		    }
		    TODO
		}
                break;
            }
        case XML_SCHEMA_FACET_PATTERN:
            facet->regexp = xmlRegexpCompile(facet->value);
            if (facet->regexp == NULL) {
		ret = XML_SCHEMAP_REGEXP_INVALID;
		/* No error message for RelaxNG. */
		if (ctxtGiven) {
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			ret, facet->node, WXS_BASIC_CAST typeDecl,
			"The value '%s' of the facet 'pattern' is not a "
			"valid regular expression",
			facet->value, NULL);
		}
            }
            break;
        case XML_SCHEMA_FACET_TOTALDIGITS:
        case XML_SCHEMA_FACET_FRACTIONDIGITS:
        case XML_SCHEMA_FACET_LENGTH:
        case XML_SCHEMA_FACET_MAXLENGTH:
        case XML_SCHEMA_FACET_MINLENGTH:

	    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
		ret = xmlSchemaValidatePredefinedType(
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_PINTEGER),
		    facet->value, &(facet->val));
	    } else {
		ret = xmlSchemaValidatePredefinedType(
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_NNINTEGER),
		    facet->value, &(facet->val));
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			PERROR_INT("xmlSchemaCheckFacet",
			    "validating facet value");
		    }
		    goto internal_error;
		}
		ret = XML_SCHEMAP_INVALID_FACET_VALUE;
		/* No error message for RelaxNG. */
		if (ctxtGiven) {
		    /* error code */
		    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
			ret, facet->node, WXS_BASIC_CAST typeDecl,
			"The value '%s' of the facet '%s' is not a valid '%s'",
			facet->value,
			xmlSchemaFacetTypeToString(facet->type),
			(facet->type != XML_SCHEMA_FACET_TOTALDIGITS) ?
			    BAD_CAST "nonNegativeInteger" :
			    BAD_CAST "positiveInteger",
			NULL);
		}
	    }
	    break;

        case XML_SCHEMA_FACET_WHITESPACE:{
                if (xmlStrEqual(facet->value, BAD_CAST "preserve")) {
                    facet->whitespace = XML_SCHEMAS_FACET_PRESERVE;
                } else if (xmlStrEqual(facet->value, BAD_CAST "replace")) {
                    facet->whitespace = XML_SCHEMAS_FACET_REPLACE;
                } else if (xmlStrEqual(facet->value, BAD_CAST "collapse")) {
                    facet->whitespace = XML_SCHEMAS_FACET_COLLAPSE;
                } else {
		    ret = XML_SCHEMAP_INVALID_FACET_VALUE;
                    /* No error message for RelaxNG. */
		    if (ctxtGiven) {
			/* error was previously: XML_SCHEMAP_INVALID_WHITE_SPACE */
			xmlSchemaCustomErr(ACTXT_CAST pctxt,
			    ret, facet->node, WXS_BASIC_CAST typeDecl,
			    "The value '%s' of the facet 'whitespace' is not "
			    "valid", facet->value, NULL);
                    }
                }
            }
        default:
            break;
    }
exit:
    if ((! ctxtGiven) && (pctxt != NULL))
	xmlSchemaFreeParserCtxt(pctxt);
    return (ret);
internal_error:
    if ((! ctxtGiven) && (pctxt != NULL))
	xmlSchemaFreeParserCtxt(pctxt);
    return (-1);
}